

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *pNtk,int nLutSize,int Id,int *pCounter)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Kit_DsdObj_t *pKVar6;
  ulong uVar7;
  
  if (-1 < Id) {
    uVar1 = pNtk->nVars;
    if (Id < (int)((uint)pNtk->nNodes + (uint)uVar1)) {
      if (Id < (int)(uint)uVar1) {
        pKVar6 = (Kit_DsdObj_t *)0x0;
      }
      else {
        pKVar6 = pNtk->pNodes[(long)Id - (ulong)uVar1];
      }
      iVar3 = 0;
      if (pKVar6 != (Kit_DsdObj_t *)0x0) {
        KVar2 = *pKVar6;
        uVar5 = (uint)KVar2 >> 6 & 7;
        if (uVar5 - 3 < 2) {
          if (((uint)KVar2 & 0xfc000000) != 0x8000000) {
            __assert_fail("pObj->nFans == 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x481,"int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *, int, int, int *)");
          }
          iVar3 = Kit_DsdCountLuts_rec(pNtk,nLutSize,(uint)(*(ushort *)(pKVar6 + 1) >> 1),pCounter);
          iVar4 = Kit_DsdCountLuts_rec
                            (pNtk,nLutSize,(uint)(*(ushort *)&pKVar6[1].field_0x2 >> 1),pCounter);
          if ((iVar3 == 0) && (iVar4 != 0)) {
            iVar3 = iVar4 + -1;
          }
          else if ((iVar3 == 0) || (iVar4 != 0)) {
            *pCounter = *pCounter + 1;
            iVar3 = nLutSize + -2;
          }
          else {
            iVar3 = iVar3 + -1;
          }
        }
        else {
          if (uVar5 != 5) {
            __assert_fail("pObj->Type == KIT_DSD_PRIME",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                          ,0x48b,"int Kit_DsdCountLuts_rec(Kit_DsdNtk_t *, int, int, int *)");
          }
          if (nLutSize < (int)((uint)KVar2 >> 0x1a)) {
            *pCounter = 1000;
            iVar3 = 0;
          }
          else {
            if (0x3ffffff < (uint)*pKVar6) {
              uVar7 = 0;
              do {
                Kit_DsdCountLuts_rec
                          (pNtk,nLutSize,
                           (uint)(*(ushort *)((long)&pKVar6[1].field_0x0 + uVar7 * 2) >> 1),pCounter
                          );
                uVar7 = uVar7 + 1;
              } while (uVar7 < (uint)*pKVar6 >> 0x1a);
            }
            *pCounter = *pCounter + 1;
            iVar3 = nLutSize - ((uint)*pKVar6 >> 0x1a);
          }
        }
      }
      return iVar3;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

int Kit_DsdCountLuts_rec( Kit_DsdNtk_t * pNtk, int nLutSize, int Id, int * pCounter )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, Res0, Res1;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR )
    {
        assert( pObj->nFans == 2 );
        Res0 = Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pObj->pFans[0]), pCounter );
        Res1 = Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(pObj->pFans[1]), pCounter );
        if ( Res0 == 0 && Res1 > 0 )
            return Res1 - 1;
        if ( Res0 > 0 && Res1 == 0 )
            return Res0 - 1;
        (*pCounter)++;
        return nLutSize - 2;
    }
    assert( pObj->Type == KIT_DSD_PRIME );
    if ( (int)pObj->nFans > nLutSize ) //+ 1 )
    {
        *pCounter = 1000;
        return 0;
    }
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        Kit_DsdCountLuts_rec( pNtk, nLutSize, Abc_Lit2Var(iLit), pCounter );
    (*pCounter)++;
//    if ( (int)pObj->nFans == nLutSize + 1 )
//        (*pCounter)++;
    return nLutSize - pObj->nFans;
}